

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

string * __thiscall
upb::generator::MultipleSourceFilename_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,FileDefPtr file,string_view full_name,
          int *i)

{
  char *__s;
  generator *this_00;
  char *pcVar1;
  int *piVar2;
  string_view fname;
  string local_100;
  AlphaNum local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  string_view local_50;
  
  piVar2 = (int *)full_name._M_str;
  pcVar1 = (char *)full_name._M_len;
  *piVar2 = *piVar2 + 1;
  __s = upb_FileDef_Name((upb_FileDef *)this);
  this_00 = (generator *)strlen(__s);
  fname._M_str = pcVar1;
  fname._M_len = (size_t)__s;
  StripExtension_abi_cxx11_(&local_100,this_00,fname);
  local_b0.piece_._M_len = local_100._M_string_length;
  local_b0.piece_._M_str = local_100._M_dataplus._M_p;
  local_e0.piece_ = absl::lts_20240722::NullSafeStringView(".upb_weak_minitables/");
  absl::lts_20240722::AlphaNum::AlphaNum(&local_80,*piVar2);
  local_50 = absl::lts_20240722::NullSafeStringView(".upb.c");
  absl::lts_20240722::StrCat_abi_cxx11_
            ((AlphaNum *)__return_storage_ptr__,&local_b0,&local_e0,&local_80);
  std::__cxx11::string::~string((string *)&local_100);
  return __return_storage_ptr__;
}

Assistant:

std::string MultipleSourceFilename(upb::FileDefPtr file,
                                   absl::string_view full_name, int* i) {
  *i += 1;
  return absl::StrCat(StripExtension(file.name()), ".upb_weak_minitables/",
                      *i, ".upb.c");
}